

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall ExprVisitorTest_VisitNot_Test::TestBody(ExprVisitorTest_VisitNot_Test *this)

{
  LogicalConstant other;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
  other_00;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_01;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_02;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> other_03;
  CStringRef arg0;
  bool bVar1;
  Message *message;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *this_00;
  MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *this_01;
  long in_RDI;
  StrictMock<MockUnhandledVisitor> visitor;
  UnsupportedError *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  LogicalExpr base;
  NotExpr e;
  BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes> *in_stack_00000428;
  ExprBase in_stack_00000430;
  Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *in_stack_fffffffffffffd58;
  MockVisitor *in_stack_fffffffffffffd60;
  ExprBase in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  Kind in_stack_fffffffffffffd74;
  int in_stack_fffffffffffffd7c;
  char *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  Type in_stack_fffffffffffffd8c;
  AssertionResult *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  ExprBase in_stack_fffffffffffffda0;
  AssertHelper *this_02;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  MockSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
  *in_stack_fffffffffffffe70;
  BasicCStringRef<char> local_b0;
  string local_a8 [32];
  AssertionResult local_88;
  undefined8 local_70;
  Impl *local_60;
  undefined8 local_58;
  BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49> local_40;
  AssertHelper local_38 [3];
  undefined8 local_20;
  Impl *local_10;
  
  local_20 = *(undefined8 *)(in_RDI + 0x1cc8);
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd74;
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd70;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffd68.impl_,
             other,(type_conflict)((ulong)in_stack_fffffffffffffd60 >> 0x20));
  local_40.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNot
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffd60,
                  (LogicalExpr)in_stack_fffffffffffffd68.impl_);
  message = (Message *)(in_RDI + 0x48);
  this_02 = local_38;
  local_10 = (Impl *)local_40.super_ExprBase.impl_;
  testing::
  Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>
  ::Matcher((Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>
             *)CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
            (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>
             )in_stack_fffffffffffffda0.impl_);
  MockVisitor::gmock_VisitNot
            (in_stack_fffffffffffffd60,
             (Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>
              *)in_stack_fffffffffffffd58);
  testing::internal::
  MockSpec<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>)>
  ::InternalExpectedAt
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  testing::
  Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>
  ::~Matcher((Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)49,_(mp::expr::Kind)49>_>
              *)0x13e77e);
  local_60 = local_10;
  other_00.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffd74;
  other_00.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffd70;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)49,(mp::expr::Kind)49>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffd68.impl_,
             other_00,(type_conflict)((ulong)in_stack_fffffffffffffd60 >> 0x20));
  local_70 = local_58;
  other_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd74;
  other_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd70;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffd68.impl_,
             other_01,(type_conflict)((ulong)in_stack_fffffffffffffd60 >> 0x20));
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)in_stack_00000428
             ,(Expr)in_stack_00000430.impl_);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (bVar1) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_b0,"unsupported: {}");
    mp::internal::ExprBase::kind((ExprBase *)0x13e844);
    in_stack_fffffffffffffda0.impl_ = (Impl *)mp::expr::str(in_stack_fffffffffffffd74);
    arg0.data_._7_1_ = in_stack_fffffffffffffd9f;
    arg0.data_._0_7_ = in_stack_fffffffffffffd98;
    fmt::format<char_const*>(arg0,(char **)in_stack_fffffffffffffd90);
    in_stack_fffffffffffffd9f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd9f) {
      testing::StrictMock<NullVisitor>::StrictMock
                ((StrictMock<NullVisitor> *)
                 CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      other_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd74;
      other_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd70;
      mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_fffffffffffffd68.impl_
                 ,other_02,(type_conflict)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 in_stack_00000428,(Expr)in_stack_00000430.impl_);
      testing::StrictMock<NullVisitor>::~StrictMock
                ((StrictMock<NullVisitor> *)in_stack_fffffffffffffd60);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffd90,
               (char (*) [127])CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    std::__cxx11::string::~string(local_a8);
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffd90);
  this_00 = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
            testing::AssertionResult::failure_message((AssertionResult *)0x13ebda);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
             (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  testing::internal::AssertHelper::operator=(this_02,message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd60);
  testing::Message::~Message((Message *)0x13ec37);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ec8f);
  testing::StrictMock<MockUnhandledVisitor>::StrictMock
            ((StrictMock<MockUnhandledVisitor> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)
             CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)in_stack_fffffffffffffda0.impl_);
  this_01 = MockUnhandledVisitor::gmock_VisitLogical
                      ((MockUnhandledVisitor *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  testing::internal::MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
  InternalExpectedAt((MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *
                     )in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                     in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)0x13ed12);
  other_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd74;
  other_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd70;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            (this_00,other_03,(type_conflict)((ulong)this_01 >> 0x20));
  mp::BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            (in_stack_00000428,(Expr)in_stack_00000430.impl_);
  testing::StrictMock<MockUnhandledVisitor>::~StrictMock
            ((StrictMock<MockUnhandledVisitor> *)this_01);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitNot) {
  auto e = factory_.MakeNot(false_);
  EXPECT_CALL(visitor_, VisitNot(e));
  mp::LogicalExpr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED_LOGICAL(base);
}